

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode trynextip(Curl_easy *data,connectdata *conn,int sockindex,int tempindex)

{
  int sock;
  CURLcode CVar1;
  Curl_addrinfo *ai;
  
  sock = conn->tempsock[(uint)tempindex];
  conn->tempsock[(uint)tempindex] = -1;
  CVar1 = CURLE_COULDNT_CONNECT;
  if (sockindex == 0) {
    ai = conn->tempaddr[(uint)tempindex];
    while ((CVar1 = CURLE_COULDNT_CONNECT, ai != (Curl_addrinfo *)0x0 &&
           (CVar1 = singleipconnect(data,conn,ai,tempindex), CVar1 == CURLE_COULDNT_CONNECT))) {
      ai = ainext(conn,tempindex,true);
    }
  }
  if (sock != -1) {
    Curl_closesocket(data,conn,sock);
  }
  return CVar1;
}

Assistant:

static CURLcode trynextip(struct Curl_easy *data,
                          struct connectdata *conn,
                          int sockindex,
                          int tempindex)
{
  CURLcode result = CURLE_COULDNT_CONNECT;

  /* First clean up after the failed socket.
     Don't close it yet to ensure that the next IP's socket gets a different
     file descriptor, which can prevent bugs when the curl_multi_socket_action
     interface is used with certain select() replacements such as kqueue. */
  curl_socket_t fd_to_close = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = CURL_SOCKET_BAD;

  if(sockindex == FIRSTSOCKET) {
    struct Curl_addrinfo *ai = conn->tempaddr[tempindex];

    while(ai) {
      result = singleipconnect(data, conn, ai, tempindex);
      if(result == CURLE_COULDNT_CONNECT) {
        ai = ainext(conn, tempindex, TRUE);
        continue;
      }
      break;
    }
  }

  if(fd_to_close != CURL_SOCKET_BAD)
    Curl_closesocket(data, conn, fd_to_close);

  return result;
}